

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

void __thiscall
FastPForLib::CSVReader::CSVReader(CSVReader *this,istream *in,string *delimiter,char commentmarker)

{
  undefined1 in_CL;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__CSVReader_00112d78;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 9),in_RDX);
  *(undefined1 *)(in_RDI + 0xd) = in_CL;
  in_RDI[0xe] = in_RSI;
  memset(in_RDI + 0xf,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1036f1);
  return;
}

Assistant:

CSVReader(std::istream *in, const std::string delimiter = ",",
            const char commentmarker = '#')
      : line(), mDelimiter(delimiter), mDelimiterPlusSpace(delimiter),
        mCommentMarker(commentmarker), mIn(in), currentData() {}